

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O1

Gia_Man_t *
Gia_ManFindPoPartition
          (Gia_Man_t *p,int SelectShift,int fOnlyCis,int fSetLargest,int fVerbose,
          Vec_Ptr_t **pvPosEquivs)

{
  void *__ptr;
  int iVar1;
  Vec_Int_t *vPivots;
  Vec_Wrd_t *vSigns;
  Vec_Ptr_t *__ptr_00;
  Gia_Man_t *pGVar2;
  long lVar3;
  int level;
  long lVar4;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vPivots = Gia_ManFindPivots(p,SelectShift,fOnlyCis,fVerbose);
  vSigns = Gia_ManDeriveSigns(p,vPivots,fVerbose);
  if (vPivots->pArray != (int *)0x0) {
    free(vPivots->pArray);
    vPivots->pArray = (int *)0x0;
  }
  if (vPivots != (Vec_Int_t *)0x0) {
    free(vPivots);
  }
  __ptr_00 = Gia_ManHashOutputs(p,vSigns,fVerbose);
  if (vSigns->pArray != (word *)0x0) {
    free(vSigns->pArray);
    vSigns->pArray = (word *)0x0;
  }
  if (vSigns != (Vec_Wrd_t *)0x0) {
    free(vSigns);
  }
  if (fSetLargest == 0) {
    pGVar2 = (Gia_Man_t *)0x0;
  }
  else {
    if (__ptr_00->nSize < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecVec.h"
                    ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
    }
    pGVar2 = Gia_ManDupCones(p,*(int **)((long)*__ptr_00->pArray + 8),
                             *(int *)((long)*__ptr_00->pArray + 4),1);
  }
  if (pvPosEquivs == (Vec_Ptr_t **)0x0) {
    if (0 < __ptr_00->nSize) {
      lVar3 = 0;
      do {
        __ptr = __ptr_00->pArray[lVar3];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
            *(undefined8 *)((long)__ptr + 8) = 0;
          }
          free(__ptr);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < __ptr_00->nSize);
    }
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (void **)0x0;
    }
    if (__ptr_00 != (Vec_Ptr_t *)0x0) {
      free(__ptr_00);
    }
  }
  else {
    *pvPosEquivs = __ptr_00;
    printf("The algorithm divided %d POs into %d partitions.   ",
           (ulong)(uint)(p->vCos->nSize - p->nRegs),(ulong)(uint)__ptr_00->nSize);
    level = 3;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  }
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManFindPoPartition( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fSetLargest, int fVerbose, Vec_Ptr_t ** pvPosEquivs )
{
    Gia_Man_t * pGia = NULL;
    Vec_Int_t * vPivots;
    Vec_Wrd_t * vSigns;
    Vec_Ptr_t * vParts;
    Vec_Int_t * vPart;
    abctime clk = Abc_Clock();
    vPivots = Gia_ManFindPivots( p, SelectShift, fOnlyCis, fVerbose );
    vSigns = Gia_ManDeriveSigns( p, vPivots, fVerbose );
    Vec_IntFree( vPivots );
    vParts = Gia_ManHashOutputs( p, vSigns, fVerbose );
    Vec_WrdFree( vSigns );
    if ( fSetLargest )
    {
        vPart = Vec_VecEntryInt( (Vec_Vec_t *)vParts, 0 );
        pGia = Gia_ManDupCones( p, Vec_IntArray(vPart), Vec_IntSize(vPart), 1 );
    }
    if ( pvPosEquivs )
    {
        *pvPosEquivs = vParts;
        printf( "The algorithm divided %d POs into %d partitions.   ", Gia_ManPoNum(p), Vec_PtrSize(vParts) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    else
        Vec_VecFree( (Vec_Vec_t *)vParts );
    return pGia;
}